

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O1

void anon_unknown.dwarf_8beaa::invertM44f(M44f *m,float e)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  M44f inv2;
  M44f inv1;
  float local_198;
  float local_188;
  float local_178;
  float local_118 [4];
  float local_108 [12];
  float local_d8 [4];
  float local_c8 [12];
  Matrix44<float> local_98;
  Matrix44<float> local_58;
  
  Imath_3_2::Matrix44<float>::inverse(&local_58,m);
  Imath_3_2::Matrix44<float>::gjInverse(&local_98,m);
  fVar4 = m->x[0][0];
  fVar5 = m->x[0][1];
  fVar6 = m->x[0][2];
  fVar7 = m->x[0][3];
  fVar8 = m->x[1][0];
  fVar9 = m->x[1][1];
  fVar10 = m->x[1][2];
  local_d8[0] = fVar7 * local_58.x[3][0] +
                fVar6 * local_58.x[2][0] + fVar4 * local_58.x[0][0] + fVar5 * local_58.x[1][0];
  fVar11 = m->x[2][2];
  fVar12 = m->x[2][3];
  fVar13 = m->x[3][0];
  fVar1 = m->x[3][1];
  fVar2 = m->x[3][2];
  fVar3 = m->x[3][3];
  local_d8[1] = fVar7 * local_58.x[3][1] +
                fVar6 * local_58.x[2][1] + fVar4 * local_58.x[0][1] + fVar5 * local_58.x[1][1];
  local_d8[2] = fVar7 * local_58.x[3][2] +
                fVar6 * local_58.x[2][2] + fVar4 * local_58.x[0][2] + fVar5 * local_58.x[1][2];
  local_d8[3] = fVar7 * local_58.x[3][3] +
                fVar6 * local_58.x[2][3] + fVar4 * local_58.x[0][3] + fVar5 * local_58.x[1][3];
  local_178 = (float)*(undefined8 *)(m->x[1] + 3);
  local_c8[0] = local_178 * local_58.x[3][0] +
                fVar10 * local_58.x[2][0] + fVar8 * local_58.x[0][0] + local_58.x[1][0] * fVar9;
  local_c8[1] = local_178 * local_58.x[3][1] +
                fVar10 * local_58.x[2][1] + fVar8 * local_58.x[0][1] + local_58.x[1][1] * fVar9;
  local_c8[2] = local_178 * local_58.x[3][2] +
                fVar10 * local_58.x[2][2] + fVar8 * local_58.x[0][2] + local_58.x[1][2] * fVar9;
  local_c8[3] = local_178 * local_58.x[3][3] +
                fVar10 * local_58.x[2][3] + fVar8 * local_58.x[0][3] + local_58.x[1][3] * fVar9;
  local_188 = (float)*(undefined8 *)(m->x[2] + 1);
  local_198 = (float)*(undefined8 *)m->x[2];
  local_c8[4] = fVar12 * local_58.x[3][0] +
                fVar11 * local_58.x[2][0] +
                local_198 * local_58.x[0][0] + local_58.x[1][0] * local_188;
  local_c8[5] = fVar12 * local_58.x[3][1] +
                fVar11 * local_58.x[2][1] +
                local_198 * local_58.x[0][1] + local_58.x[1][1] * local_188;
  local_c8[6] = fVar12 * local_58.x[3][2] +
                fVar11 * local_58.x[2][2] +
                local_198 * local_58.x[0][2] + local_58.x[1][2] * local_188;
  local_c8[7] = fVar12 * local_58.x[3][3] +
                fVar11 * local_58.x[2][3] +
                local_198 * local_58.x[0][3] + local_58.x[1][3] * local_188;
  local_c8[8] = local_58.x[3][0] * fVar3 +
                local_58.x[2][0] * fVar2 + local_58.x[0][0] * fVar13 + local_58.x[1][0] * fVar1;
  local_c8[9] = local_58.x[3][1] * fVar3 +
                local_58.x[2][1] * fVar2 + local_58.x[0][1] * fVar13 + local_58.x[1][1] * fVar1;
  local_c8[10] = local_58.x[3][2] * fVar3 +
                 local_58.x[2][2] * fVar2 + local_58.x[0][2] * fVar13 + local_58.x[1][2] * fVar1;
  local_c8[0xb] =
       local_58.x[3][3] * fVar3 +
       local_58.x[2][3] * fVar2 + local_58.x[0][3] * fVar13 + local_58.x[1][3] * fVar1;
  local_118[0] = fVar7 * local_98.x[3][0] +
                 fVar6 * local_98.x[2][0] + fVar4 * local_98.x[0][0] + fVar5 * local_98.x[1][0];
  local_118[1] = fVar7 * local_98.x[3][1] +
                 fVar6 * local_98.x[2][1] + fVar4 * local_98.x[0][1] + fVar5 * local_98.x[1][1];
  local_118[2] = fVar7 * local_98.x[3][2] +
                 fVar6 * local_98.x[2][2] + fVar4 * local_98.x[0][2] + fVar5 * local_98.x[1][2];
  local_118[3] = fVar7 * local_98.x[3][3] +
                 fVar6 * local_98.x[2][3] + fVar4 * local_98.x[0][3] + fVar5 * local_98.x[1][3];
  local_108[0] = local_178 * local_98.x[3][0] +
                 fVar10 * local_98.x[2][0] + fVar8 * local_98.x[0][0] + fVar9 * local_98.x[1][0];
  local_108[1] = local_178 * local_98.x[3][1] +
                 fVar10 * local_98.x[2][1] + fVar8 * local_98.x[0][1] + fVar9 * local_98.x[1][1];
  local_108[2] = local_178 * local_98.x[3][2] +
                 fVar10 * local_98.x[2][2] + fVar8 * local_98.x[0][2] + fVar9 * local_98.x[1][2];
  local_108[3] = local_178 * local_98.x[3][3] +
                 fVar10 * local_98.x[2][3] + fVar8 * local_98.x[0][3] + fVar9 * local_98.x[1][3];
  local_108[4] = fVar12 * local_98.x[3][0] +
                 fVar11 * local_98.x[2][0] +
                 local_198 * local_98.x[0][0] + local_188 * local_98.x[1][0];
  local_108[5] = fVar12 * local_98.x[3][1] +
                 fVar11 * local_98.x[2][1] +
                 local_198 * local_98.x[0][1] + local_188 * local_98.x[1][1];
  local_108[6] = fVar12 * local_98.x[3][2] +
                 fVar11 * local_98.x[2][2] +
                 local_198 * local_98.x[0][2] + local_188 * local_98.x[1][2];
  local_108[7] = fVar12 * local_98.x[3][3] +
                 fVar11 * local_98.x[2][3] +
                 local_198 * local_98.x[0][3] + local_188 * local_98.x[1][3];
  local_108[8] = fVar3 * local_98.x[3][0] +
                 fVar2 * local_98.x[2][0] + fVar13 * local_98.x[0][0] + fVar1 * local_98.x[1][0];
  local_108[9] = fVar3 * local_98.x[3][1] +
                 fVar2 * local_98.x[2][1] + fVar13 * local_98.x[0][1] + fVar1 * local_98.x[1][1];
  local_108[10] =
       fVar3 * local_98.x[3][2] +
       fVar2 * local_98.x[2][2] + fVar13 * local_98.x[0][2] + fVar1 * local_98.x[1][2];
  local_108[0xb] =
       fVar3 * local_98.x[3][3] +
       fVar2 * local_98.x[2][3] + fVar13 * local_98.x[0][3] + fVar1 * local_98.x[1][3];
  if ((float)(~-(uint)((float)Imath_3_2::identity44f < local_d8[0]) &
              (uint)((float)Imath_3_2::identity44f - local_d8[0]) |
             (uint)(local_d8[0] - (float)Imath_3_2::identity44f) &
             -(uint)((float)Imath_3_2::identity44f < local_d8[0])) <= e) {
    lVar14 = 0x17f2dc;
    pfVar15 = local_d8 + 1;
    bVar18 = false;
    uVar17 = 0;
    do {
      uVar16 = 0xffffffffffffffff;
      do {
        if (uVar16 == 2) goto LAB_0013c3a7;
        fVar1 = pfVar15[uVar16 + 1];
        fVar2 = *(float *)(lVar14 + 4 + uVar16 * 4);
        uVar16 = uVar16 + 1;
      } while ((float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                      (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1)) <= e);
      if (uVar16 < 3) break;
LAB_0013c3a7:
      uVar16 = uVar17 + 1;
      bVar18 = 2 < uVar17;
      if (uVar16 == 4) break;
      fVar1 = local_d8[uVar16 * 4];
      fVar2 = *(float *)(&Imath_3_2::identity44f + uVar16 * 2);
      pfVar15 = pfVar15 + 4;
      lVar14 = lVar14 + 0x10;
      uVar17 = uVar16;
    } while ((float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                    (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1)) <= e);
    if (bVar18) {
      if ((float)(~-(uint)((float)Imath_3_2::identity44f < local_118[0]) &
                  (uint)((float)Imath_3_2::identity44f - local_118[0]) |
                 (uint)(local_118[0] - (float)Imath_3_2::identity44f) &
                 -(uint)((float)Imath_3_2::identity44f < local_118[0])) <= e) {
        lVar14 = 0x17f2dc;
        pfVar15 = local_118 + 1;
        bVar18 = false;
        uVar17 = 0;
        do {
          uVar16 = 0xffffffffffffffff;
          do {
            if (uVar16 == 2) goto LAB_0013c48e;
            fVar1 = pfVar15[uVar16 + 1];
            fVar2 = *(float *)(lVar14 + 4 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while ((float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                          (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1)) <= e);
          if (uVar16 < 3) break;
LAB_0013c48e:
          uVar16 = uVar17 + 1;
          bVar18 = 2 < uVar17;
          if (uVar16 == 4) break;
          fVar1 = local_118[uVar16 * 4];
          fVar2 = *(float *)(&Imath_3_2::identity44f + uVar16 * 2);
          pfVar15 = pfVar15 + 4;
          lVar14 = lVar14 + 0x10;
          uVar17 = uVar16;
        } while ((float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                        (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1)) <= e);
        if (bVar18) {
          return;
        }
      }
      __assert_fail("ident2.equalWithAbsError (identity44f, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                    ,0x23,"void (anonymous namespace)::invertM44f(const M44f &, float)");
    }
  }
  __assert_fail("ident1.equalWithAbsError (identity44f, e)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                ,0x22,"void (anonymous namespace)::invertM44f(const M44f &, float)");
}

Assistant:

void
invertM44f (const M44f& m, float e)
{
    M44f inv1   = m.inverse ();
    M44f inv2   = m.gjInverse ();
    M44f ident1 = m * inv1;
    M44f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity44f, e));
    assert (ident2.equalWithAbsError (identity44f, e));
}